

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTargetInternals::ComputeLinkInterface
          (cmTargetInternals *this,cmTarget *thisTarget,string *config,OptionalLinkInterface *iface,
          cmTarget *headTarget)

{
  bool bVar1;
  TargetType TVar2;
  PolicyStatus PVar3;
  reference __obj;
  reference pcVar4;
  pointer pcVar5;
  LinkImplementationLibraries *pLVar6;
  ulong uVar7;
  char *pcVar8;
  allocator local_179;
  string local_178;
  char *local_158;
  char *reps;
  char *config_reps;
  undefined1 local_140 [8];
  string propName;
  allocator local_f9;
  string local_f8 [8];
  string suffix;
  LinkImplementation *impl_2;
  LinkImplementationLibraries *impl_1;
  bool local_b8;
  __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
  local_b0;
  __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
  local_a8;
  const_iterator li_1;
  LinkImplementation *impl;
  pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
  local_88;
  __normal_iterator<cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_> local_70;
  __normal_iterator<cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_> local_68;
  __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
  local_60;
  const_iterator li;
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  emitted;
  cmTarget *headTarget_local;
  OptionalLinkInterface *iface_local;
  string *config_local;
  cmTarget *thisTarget_local;
  cmTargetInternals *this_local;
  
  if (iface->ExplicitLibraries == (char *)0x0) {
    PVar3 = cmTarget::GetPolicyStatusCMP0022(thisTarget);
    if ((PVar3 == WARN) || (PVar3 = cmTarget::GetPolicyStatusCMP0022(thisTarget), PVar3 == OLD)) {
      pLVar6 = cmTarget::GetLinkImplementationLibrariesInternal(thisTarget,config,headTarget);
      (iface->super_LinkInterface).ImplementationIsInterface = true;
      std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::operator=
                (&(iface->super_LinkInterface).WrongConfigLibraries,&pLVar6->WrongConfigLibraries);
    }
  }
  else {
    TVar2 = cmTarget::GetType(thisTarget);
    if (((TVar2 == SHARED_LIBRARY) ||
        (TVar2 = cmTarget::GetType(thisTarget), TVar2 == STATIC_LIBRARY)) ||
       (TVar2 = cmTarget::GetType(thisTarget), TVar2 == INTERFACE_LIBRARY)) {
      cmsys::
      hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::hash_set((hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                  *)&li);
      local_68._M_current =
           (cmLinkItem *)
           std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin
                     ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface);
      __gnu_cxx::
      __normal_iterator<cmLinkItem_const*,std::vector<cmLinkItem,std::allocator<cmLinkItem>>>::
      __normal_iterator<cmLinkItem*>
                ((__normal_iterator<cmLinkItem_const*,std::vector<cmLinkItem,std::allocator<cmLinkItem>>>
                  *)&local_60,&local_68);
      while( true ) {
        local_70._M_current =
             (cmLinkItem *)
             std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end
                       ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface);
        bVar1 = __gnu_cxx::operator!=(&local_60,&local_70);
        if (!bVar1) break;
        __obj = __gnu_cxx::
                __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                ::operator*(&local_60);
        cmsys::
        hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
        ::insert(&local_88,
                 (hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                  *)&li,&__obj->super_string);
        __gnu_cxx::
        __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
        ::operator++(&local_60);
      }
      TVar2 = cmTarget::GetType(thisTarget);
      if (TVar2 != INTERFACE_LIBRARY) {
        li_1._M_current = (cmLinkImplItem *)cmTarget::GetLinkImplementation(thisTarget,config);
        local_a8._M_current =
             (cmLinkImplItem *)
             std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin
                       ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)li_1._M_current);
        while( true ) {
          local_b0._M_current =
               (cmLinkImplItem *)
               std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end(li_1._M_current);
          bVar1 = __gnu_cxx::operator!=(&local_a8,&local_b0);
          if (!bVar1) break;
          pcVar4 = __gnu_cxx::
                   __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                   ::operator*(&local_a8);
          cmsys::
          hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
          ::insert((pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                    *)&impl_1,
                   (hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                    *)&li,(value_type *)pcVar4);
          if (((local_b8 & 1U) != 0) &&
             (pcVar5 = __gnu_cxx::
                       __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                       ::operator->(&local_a8), (pcVar5->super_cmLinkItem).Target != (cmTarget *)0x0
             )) {
            pcVar5 = __gnu_cxx::
                     __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                     ::operator->(&local_a8);
            TVar2 = cmTarget::GetType((pcVar5->super_cmLinkItem).Target);
            if (TVar2 == SHARED_LIBRARY) {
              pcVar4 = __gnu_cxx::
                       __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                       ::operator*(&local_a8);
              std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::push_back
                        (&(iface->super_LinkInterface).SharedDeps,&pcVar4->super_cmLinkItem);
            }
          }
          __gnu_cxx::
          __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
          ::operator++(&local_a8);
        }
      }
      cmsys::
      hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::~hash_set((hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                   *)&li);
    }
  }
  bVar1 = cmTarget::LinkLanguagePropagatesToDependents(thisTarget);
  if ((bVar1) &&
     (suffix.field_2._8_8_ = cmTarget::GetLinkImplementation(thisTarget,config),
     (LinkImplementation *)suffix.field_2._8_8_ != (LinkImplementation *)0x0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&(iface->super_LinkInterface).Languages,
                &((LinkImplementation *)suffix.field_2._8_8_)->Languages);
  }
  TVar2 = cmTarget::GetType(thisTarget);
  if (TVar2 == STATIC_LIBRARY) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,"_",&local_f9);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      cmsys::SystemTools::UpperCase((string *)((long)&propName.field_2 + 8),config);
      std::__cxx11::string::operator+=(local_f8,(string *)(propName.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(propName.field_2._M_local_buf + 8));
    }
    else {
      std::__cxx11::string::operator+=(local_f8,"NOCONFIG");
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_140,"LINK_INTERFACE_MULTIPLICITY",
               (allocator *)((long)&config_reps + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&config_reps + 7));
    std::__cxx11::string::operator+=((string *)local_140,local_f8);
    reps = cmTarget::GetProperty(thisTarget,(string *)local_140);
    if (reps == (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_178,"LINK_INTERFACE_MULTIPLICITY",&local_179);
      pcVar8 = cmTarget::GetProperty(thisTarget,&local_178);
      std::__cxx11::string::~string((string *)&local_178);
      std::allocator<char>::~allocator((allocator<char> *)&local_179);
      local_158 = pcVar8;
      if (pcVar8 != (char *)0x0) {
        __isoc99_sscanf(pcVar8,"%u",&(iface->super_LinkInterface).Multiplicity);
      }
    }
    else {
      __isoc99_sscanf(reps,"%u",&(iface->super_LinkInterface).Multiplicity);
    }
    std::__cxx11::string::~string((string *)local_140);
    std::__cxx11::string::~string(local_f8);
  }
  return;
}

Assistant:

void cmTargetInternals::ComputeLinkInterface(cmTarget const* thisTarget,
                                             const std::string& config,
                                             OptionalLinkInterface& iface,
                                             cmTarget const* headTarget) const
{
  if(iface.ExplicitLibraries)
    {
    if(thisTarget->GetType() == cmTarget::SHARED_LIBRARY
        || thisTarget->GetType() == cmTarget::STATIC_LIBRARY
        || thisTarget->GetType() == cmTarget::INTERFACE_LIBRARY)
      {
      // Shared libraries may have runtime implementation dependencies
      // on other shared libraries that are not in the interface.
      UNORDERED_SET<std::string> emitted;
      for(std::vector<cmLinkItem>::const_iterator
          li = iface.Libraries.begin(); li != iface.Libraries.end(); ++li)
        {
        emitted.insert(*li);
        }
      if (thisTarget->GetType() != cmTarget::INTERFACE_LIBRARY)
        {
        cmTarget::LinkImplementation const* impl =
            thisTarget->GetLinkImplementation(config);
        for(std::vector<cmLinkImplItem>::const_iterator
              li = impl->Libraries.begin(); li != impl->Libraries.end(); ++li)
          {
          if(emitted.insert(*li).second)
            {
            if(li->Target)
              {
              // This is a runtime dependency on another shared library.
              if(li->Target->GetType() == cmTarget::SHARED_LIBRARY)
                {
                iface.SharedDeps.push_back(*li);
                }
              }
            else
              {
              // TODO: Recognize shared library file names.  Perhaps this
              // should be moved to cmComputeLinkInformation, but that creates
              // a chicken-and-egg problem since this list is needed for its
              // construction.
              }
            }
          }
        }
      }
    }
  else if (thisTarget->GetPolicyStatusCMP0022() == cmPolicies::WARN
        || thisTarget->GetPolicyStatusCMP0022() == cmPolicies::OLD)
    {
    // The link implementation is the default link interface.
    cmTarget::LinkImplementationLibraries const*
      impl = thisTarget->GetLinkImplementationLibrariesInternal(config,
                                                                headTarget);
    iface.ImplementationIsInterface = true;
    iface.WrongConfigLibraries = impl->WrongConfigLibraries;
    }

  if(thisTarget->LinkLanguagePropagatesToDependents())
    {
    // Targets using this archive need its language runtime libraries.
    if(cmTarget::LinkImplementation const* impl =
       thisTarget->GetLinkImplementation(config))
      {
      iface.Languages = impl->Languages;
      }
    }

  if(thisTarget->GetType() == cmTarget::STATIC_LIBRARY)
    {
    // Construct the property name suffix for this configuration.
    std::string suffix = "_";
    if(!config.empty())
      {
      suffix += cmSystemTools::UpperCase(config);
      }
    else
      {
      suffix += "NOCONFIG";
      }

    // How many repetitions are needed if this library has cyclic
    // dependencies?
    std::string propName = "LINK_INTERFACE_MULTIPLICITY";
    propName += suffix;
    if(const char* config_reps = thisTarget->GetProperty(propName))
      {
      sscanf(config_reps, "%u", &iface.Multiplicity);
      }
    else if(const char* reps =
            thisTarget->GetProperty("LINK_INTERFACE_MULTIPLICITY"))
      {
      sscanf(reps, "%u", &iface.Multiplicity);
      }
    }
}